

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QRect __thiscall QToolBarAreaLayout::itemRect(QToolBarAreaLayout *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  QRect *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  int i;
  QRect r;
  QList<int> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  long pos;
  LayoutDirection direction;
  undefined1 in_stack_ffffffffffffffc0 [16];
  undefined1 local_18 [16];
  undefined1 auVar5 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos = in_RDI;
  piVar2 = QList<int>::first(in_stack_ffffffffffffff90);
  iVar4 = *piVar2;
  QList<int>::mid(in_stack_ffffffffffffffc0._0_8_,pos,(qsizetype)in_RSI);
  direction = (LayoutDirection)((ulong)pos >> 0x20);
  local_18 = (undefined1  [16])
             QToolBarAreaLayoutInfo::itemRect
                       (in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_);
  QList<int>::~QList((QList<int> *)0x6f4f7d);
  if (*(int *)(in_RDI + (long)iVar4 * 0x38 + 0x40) == 1) {
    QWidget::layoutDirection((QWidget *)0x6f4fa6);
    local_18 = (undefined1  [16])
               QStyle::visualRect(direction,in_RSI,
                                  (QRect *)CONCAT44(iVar4,in_stack_ffffffffffffffa8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar3.x1.m_i = local_18._0_4_;
    auVar5._4_4_ = local_18._4_4_;
    QVar3.x2.m_i = local_18._8_4_;
    QVar3.y2.m_i = local_18._12_4_;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QToolBarAreaLayout::itemRect(const QList<int> &path) const
{
    const int i = path.first();

    QRect r = docks[i].itemRect(path.mid(1));
    if (docks[i].o == Qt::Horizontal)
        r = QStyle::visualRect(mainWindow->layoutDirection(),
                                docks[i].rect, r);
    return r;
}